

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu_renderer.c
# Opt level: O3

void GPU_GetActiveRendererList(GPU_RendererID *renderers_array)

{
  GPU_RendererID *pGVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  long lVar4;
  int iVar5;
  
  gpu_init_renderer_register();
  lVar4 = 0;
  iVar5 = 0;
  do {
    puVar2 = *(undefined8 **)((long)_gpu_renderer_map + lVar4);
    if (puVar2 != (undefined8 *)0x0) {
      *(undefined8 *)&renderers_array[iVar5].minor_version = puVar2[2];
      uVar3 = puVar2[1];
      pGVar1 = renderers_array + iVar5;
      pGVar1->name = (char *)*puVar2;
      pGVar1->renderer = (int)uVar3;
      pGVar1->major_version = (int)((ulong)uVar3 >> 0x20);
      iVar5 = iVar5 + 1;
    }
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0xa0);
  return;
}

Assistant:

void GPU_GetActiveRendererList(GPU_RendererID* renderers_array)
{
	int count;
	int i;

	gpu_init_renderer_register();

	count = 0;
	for(i = 0; i < GPU_MAX_ACTIVE_RENDERERS; i++)
	{
		if(_gpu_renderer_map[i] != NULL)
		{
			renderers_array[count] = _gpu_renderer_map[i]->id;
			count++;
		}
	}
}